

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

Aig_Obj_t * Aig_TableLookupInt(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p1_local;
  Aig_Obj_t *p0_local;
  Aig_Man_t *p_local;
  
  p_local = (Aig_Man_t *)p0;
  if (p0 != p1) {
    pAVar2 = Aig_ManConst0(p);
    if (((p0 == pAVar2) || (pAVar2 = Aig_ManConst0(p), p1 == pAVar2)) ||
       (pAVar2 = Aig_Not(p1), p0 == pAVar2)) {
      p_local = (Aig_Man_t *)Aig_ManConst0(p);
    }
    else {
      pAVar2 = Aig_ManConst1(p);
      p_local = (Aig_Man_t *)p1;
      if ((p0 != pAVar2) && (pAVar2 = Aig_ManConst1(p), p_local = (Aig_Man_t *)p0, p1 != pAVar2)) {
        pAVar2 = Aig_Regular(p0);
        iVar1 = pAVar2->Id;
        pAVar2 = Aig_Regular(p1);
        if (iVar1 < pAVar2->Id) {
          pAVar2 = Aig_ObjCreateGhost(p,p0,p1,AIG_OBJ_AND);
          p_local = (Aig_Man_t *)Aig_TableLookup(p,pAVar2);
        }
        else {
          pAVar2 = Aig_ObjCreateGhost(p,p1,p0,AIG_OBJ_AND);
          p_local = (Aig_Man_t *)Aig_TableLookup(p,pAVar2);
        }
      }
    }
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Aig_TableLookupInt( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1 )
{
    if ( p0 == p1 )
        return p0;
    if ( p0 == Aig_ManConst0(p) || p1 == Aig_ManConst0(p) || p0 == Aig_Not(p1) )
        return Aig_ManConst0(p);
    if ( p0 == Aig_ManConst1(p) )
        return p1;
    if ( p1 == Aig_ManConst1(p) )
        return p0;
    if ( Aig_Regular(p0)->Id < Aig_Regular(p1)->Id )
        return Aig_TableLookup( p, Aig_ObjCreateGhost(p, p0, p1, AIG_OBJ_AND) );
    return Aig_TableLookup( p, Aig_ObjCreateGhost(p, p1, p0, AIG_OBJ_AND) );
}